

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nativefunction.cpp
# Opt level: O0

void sos::NativeFunction::greaterEqual(VariableStack *stack)

{
  int iVar1;
  string local_68;
  int local_48;
  int right;
  string local_38;
  int local_14;
  VariableStack *pVStack_10;
  int left;
  VariableStack *stack_local;
  
  pVStack_10 = stack;
  VariableStack::take_abi_cxx11_(&local_38,stack);
  iVar1 = std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_38);
  local_14 = iVar1;
  VariableStack::take_abi_cxx11_(&local_68,pVStack_10);
  iVar1 = std::__cxx11::stoi(&local_68,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_68);
  local_48 = iVar1;
  VariableStack::load(pVStack_10,iVar1 <= local_14);
  return;
}

Assistant:

void sos::NativeFunction::greaterEqual(sos::VariableStack *stack) {
    int left = std::stoi(stack->take());
    int right = std::stoi(stack->take());
    stack->load(left >= right);
}